

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputAESEncodeStream.cpp
# Opt level: O1

void __thiscall
OutputAESEncodeStream::OutputAESEncodeStream
          (OutputAESEncodeStream *this,IByteWriterWithPosition *inTargetStream,
          ByteList *inEncryptionKey,bool inOwnsStream)

{
  ulong uVar1;
  uchar *puVar2;
  _List_node_base *p_Var3;
  long lVar4;
  
  (this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter =
       (_func_int **)&PTR__OutputAESEncodeStream_003abb60;
  aes_init();
  this->mTargetStream = inTargetStream;
  this->mOwnsStream = inOwnsStream;
  if (inTargetStream != (IByteWriterWithPosition *)0x0) {
    this->mInIndex = this->mIn;
    uVar1 = (inEncryptionKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl._M_node._M_size;
    puVar2 = (uchar *)operator_new__(uVar1);
    this->mEncryptionKey = puVar2;
    this->mEncryptionKeyLength = uVar1;
    p_Var3 = (inEncryptionKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)inEncryptionKey) {
      lVar4 = 0;
      do {
        this->mEncryptionKey[lVar4] = *(uchar *)&p_Var3[1]._M_next;
        lVar4 = lVar4 + 1;
        p_Var3 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var3->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var3 != (_List_node_base *)inEncryptionKey);
    }
    aes_encrypt_key(this->mEncryptionKey,(int)this->mEncryptionKeyLength,(this->mEncrypt).cx);
    this->mWroteIV = false;
  }
  return;
}

Assistant:

OutputAESEncodeStream::OutputAESEncodeStream(IByteWriterWithPosition* inTargetStream, const ByteList& inEncryptionKey, bool inOwnsStream) 
{
	mTargetStream = inTargetStream;
	mOwnsStream = inOwnsStream;

	if (!mTargetStream)
		return;

	mInIndex = mIn;

	// convert inEncryptionKey to internal rep and init encrypt [let's hope its 16...]
	mEncryptionKey = new unsigned char[inEncryptionKey.size()];
	mEncryptionKeyLength = inEncryptionKey.size();
	ByteList::const_iterator it = inEncryptionKey.begin();
	size_t i = 0;
	for (; it != inEncryptionKey.end(); ++i, ++it)
		mEncryptionKey[i] = *it;
	mEncrypt.key(mEncryptionKey, mEncryptionKeyLength);
	
	mWroteIV = false;

}